

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint generateFixedLitLenTree(HuffmanTree *tree)

{
  uint uVar1;
  uint *bitlen;
  long lVar2;
  
  bitlen = (uint *)malloc(0x480);
  if (bitlen == (uint *)0x0) {
    uVar1 = 0x53;
  }
  else {
    for (lVar2 = 0; lVar2 != 0x90; lVar2 = lVar2 + 1) {
      bitlen[lVar2] = 8;
    }
    for (lVar2 = 0x90; lVar2 != 0x100; lVar2 = lVar2 + 1) {
      bitlen[lVar2] = 9;
    }
    for (lVar2 = 0x100; lVar2 != 0x118; lVar2 = lVar2 + 1) {
      bitlen[lVar2] = 7;
    }
    for (lVar2 = 0x118; lVar2 != 0x120; lVar2 = lVar2 + 1) {
      bitlen[lVar2] = 8;
    }
    uVar1 = HuffmanTree_makeFromLengths(tree,bitlen,0x120,0xf);
    free(bitlen);
  }
  return uVar1;
}

Assistant:

static unsigned generateFixedLitLenTree(HuffmanTree* tree) {
  unsigned i, error = 0;
  unsigned* bitlen = (unsigned*)lodepng_malloc(NUM_DEFLATE_CODE_SYMBOLS * sizeof(unsigned));
  if (!bitlen) return 83; /*alloc fail*/

  /*288 possible codes: 0-255=literals, 256=endcode, 257-285=lengthcodes, 286-287=unused*/
  for (i = 0; i <= 143; ++i) bitlen[i] = 8;
  for (i = 144; i <= 255; ++i) bitlen[i] = 9;
  for (i = 256; i <= 279; ++i) bitlen[i] = 7;
  for (i = 280; i <= 287; ++i) bitlen[i] = 8;

  error = HuffmanTree_makeFromLengths(tree, bitlen, NUM_DEFLATE_CODE_SYMBOLS, 15);

  lodepng_free(bitlen);
  return error;
}